

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O2

void __thiscall Catch::XmlReporter::testCaseStarting(XmlReporter *this,TestCaseInfo *testInfo)

{
  XmlWriter *this_00;
  int iVar1;
  uint64_t uVar2;
  StringRef name;
  StringRef name_00;
  StringRef SVar3;
  size_type in_stack_ffffffffffffff98;
  StringRef local_60;
  string local_40;
  
  (this->super_StreamingReporterBase).currentTestCaseInfo = testInfo;
  this_00 = &this->m_xml;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"TestCase",(allocator<char> *)&stack0xffffffffffffff9f);
  XmlWriter::startElement(this_00,&local_40,Newline|Indent);
  SVar3.m_size = in_stack_ffffffffffffff98;
  SVar3.m_start = (char *)0x13448d;
  SVar3 = trim(SVar3);
  name.m_size = 4;
  name.m_start = "name";
  XmlWriter::writeAttribute(this_00,name,SVar3);
  TestCaseInfo::tagsAsString_abi_cxx11_((string *)&local_60,testInfo);
  name_00.m_size = 4;
  name_00.m_start = "tags";
  XmlWriter::writeAttribute(this_00,name_00,local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  writeSourceInfo(this,&testInfo->lineInfo);
  iVar1 = (*((this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener.m_config)->
            _vptr_IConfig[0xb])();
  if (iVar1 == 1) {
    uVar2 = std::chrono::_V2::system_clock::now();
    (this->m_testCaseTimer).m_nanoseconds = uVar2;
  }
  XmlWriter::ensureTagClosed(this_00);
  return;
}

Assistant:

void XmlReporter::testCaseStarting( TestCaseInfo const& testInfo ) {
        StreamingReporterBase::testCaseStarting(testInfo);
        m_xml.startElement( "TestCase" )
            .writeAttribute( "name"_sr, trim( StringRef(testInfo.name) ) )
            .writeAttribute( "tags"_sr, testInfo.tagsAsString() );

        writeSourceInfo( testInfo.lineInfo );

        if ( m_config->showDurations() == ShowDurations::Always )
            m_testCaseTimer.start();
        m_xml.ensureTagClosed();
    }